

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

TimeConversion *
absl::ConvertDateTime
          (TimeConversion *__return_storage_ptr__,long year,int mon,int day,int hour,int min,int sec
          ,int64_t param_8)

{
  CivilSecond ct;
  int iVar1;
  year_t yVar2;
  undefined1 local_70 [8];
  TimeInfo ti;
  CivilSecond cs;
  int min_local;
  int hour_local;
  int day_local;
  int mon_local;
  int64_t year_local;
  TimeZone tz_local;
  
  year_local = param_8;
  if (year < 0x45d964b801) {
    if (year < -300000000000) {
      anon_unknown_8::InfinitePastTimeConversion();
    }
    else {
      time_internal::cctz::detail::civil_time<absl::time_internal::second_tag>::civil_time
                ((civil_time<absl::time_internal::second_tag> *)&ti.post.rep_.rep_lo_,year,(long)mon
                 ,(long)day,(long)hour,(long)min,(long)sec);
      ct.f_._8_8_ = cs.f_.y;
      ct.f_.y = ti.post.rep_._8_8_;
      TimeZone::At((TimeInfo *)local_70,(TimeZone *)&year_local,ct);
      TimeConversion::TimeConversion(__return_storage_ptr__);
      (__return_storage_ptr__->pre).rep_.rep_hi_ = ti._0_8_;
      *(int64_t *)&(__return_storage_ptr__->pre).rep_.rep_lo_ = ti.pre.rep_.rep_hi_;
      (__return_storage_ptr__->trans).rep_.rep_hi_ = ti.pre.rep_._8_8_;
      *(int64_t *)&(__return_storage_ptr__->trans).rep_.rep_lo_ = ti.trans.rep_.rep_hi_;
      (__return_storage_ptr__->post).rep_.rep_hi_ = ti.trans.rep_._8_8_;
      *(int64_t *)&(__return_storage_ptr__->post).rep_.rep_lo_ = ti.post.rep_.rep_hi_;
      if (local_70._0_4_ == UNIQUE) {
        __return_storage_ptr__->kind = UNIQUE;
      }
      else if (local_70._0_4_ == SKIPPED) {
        __return_storage_ptr__->kind = SKIPPED;
      }
      else if (local_70._0_4_ == REPEATED) {
        __return_storage_ptr__->kind = REPEATED;
      }
      __return_storage_ptr__->normalized = false;
      yVar2 = time_internal::cctz::detail::civil_time<absl::time_internal::second_tag>::year
                        ((civil_time<absl::time_internal::second_tag> *)&ti.post.rep_.rep_lo_);
      if ((((year != yVar2) ||
           (iVar1 = time_internal::cctz::detail::civil_time<absl::time_internal::second_tag>::month
                              ((civil_time<absl::time_internal::second_tag> *)&ti.post.rep_.rep_lo_)
           , mon != iVar1)) ||
          (iVar1 = time_internal::cctz::detail::civil_time<absl::time_internal::second_tag>::day
                             ((civil_time<absl::time_internal::second_tag> *)&ti.post.rep_.rep_lo_),
          day != iVar1)) ||
         (((iVar1 = time_internal::cctz::detail::civil_time<absl::time_internal::second_tag>::hour
                              ((civil_time<absl::time_internal::second_tag> *)&ti.post.rep_.rep_lo_)
           , hour != iVar1 ||
           (iVar1 = time_internal::cctz::detail::civil_time<absl::time_internal::second_tag>::minute
                              ((civil_time<absl::time_internal::second_tag> *)&ti.post.rep_.rep_lo_)
           , min != iVar1)) ||
          (iVar1 = time_internal::cctz::detail::civil_time<absl::time_internal::second_tag>::second
                             ((civil_time<absl::time_internal::second_tag> *)&ti.post.rep_.rep_lo_),
          sec != iVar1)))) {
        __return_storage_ptr__->normalized = true;
      }
    }
  }
  else {
    anon_unknown_8::InfiniteFutureTimeConversion();
  }
  return __return_storage_ptr__;
}

Assistant:

absl::TimeConversion ConvertDateTime(int64_t year, int mon, int day, int hour,
                                     int min, int sec, TimeZone tz) {
  // Avoids years that are too extreme for CivilSecond to normalize.
  if (year > 300000000000) return InfiniteFutureTimeConversion();
  if (year < -300000000000) return InfinitePastTimeConversion();

  const CivilSecond cs(year, mon, day, hour, min, sec);
  const auto ti = tz.At(cs);

  TimeConversion tc;
  tc.pre = ti.pre;
  tc.trans = ti.trans;
  tc.post = ti.post;
  switch (ti.kind) {
    case TimeZone::TimeInfo::UNIQUE:
      tc.kind = TimeConversion::UNIQUE;
      break;
    case TimeZone::TimeInfo::SKIPPED:
      tc.kind = TimeConversion::SKIPPED;
      break;
    case TimeZone::TimeInfo::REPEATED:
      tc.kind = TimeConversion::REPEATED;
      break;
  }
  tc.normalized = false;
  if (year != cs.year() || mon != cs.month() || day != cs.day() ||
      hour != cs.hour() || min != cs.minute() || sec != cs.second()) {
    tc.normalized = true;
  }
  return tc;
}